

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

void __thiscall
chaiscript::exception::file_not_found_error::~file_not_found_error(file_not_found_error *this)

{
  ~file_not_found_error(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~file_not_found_error() noexcept override = default;